

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

bool sentencepiece::TrainerSpec_ModelType_Parse(ConstStringParam name,TrainerSpec_ModelType *value)

{
  bool bVar1;
  int *in_R9;
  StringPiece name_00;
  int int_value;
  TrainerSpec_ModelType local_c;
  
  name_00.length_ = (stringpiece_ssize_type)&local_c;
  name_00.ptr_ = (char *)name->_M_string_length;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)TrainerSpec_ModelType_entries,(EnumEntry *)0x4,
                     (size_t)(name->_M_dataplus)._M_p,name_00,in_R9);
  if (bVar1) {
    *value = local_c;
  }
  return bVar1;
}

Assistant:

bool TrainerSpec_ModelType_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, TrainerSpec_ModelType* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      TrainerSpec_ModelType_entries, 4, name, &int_value);
  if (success) {
    *value = static_cast<TrainerSpec_ModelType>(int_value);
  }
  return success;
}